

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

bool __thiscall Item::operator<(Item *this,Item *o)

{
  int iVar1;
  runtime_error *this_00;
  const_reference pvVar2;
  int local_138;
  int i;
  char local_128 [8];
  char _error_msg_ [256];
  Item *o_local;
  Item *this_local;
  
  if (this->ndims != o->ndims) {
    snprintf(local_128,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ndims == o.ndims",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x11);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_128);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = this->key - o->key;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if ((double)iVar1 < 1e-05) {
    for (local_138 = 0; local_138 < this->ndims; local_138 = local_138 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->w,(long)local_138);
      iVar1 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&o->w,(long)local_138);
      if (iVar1 != *pvVar2) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->w,(long)local_138);
        iVar1 = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&o->w,(long)local_138);
        return iVar1 < *pvVar2;
      }
    }
    this_local._7_1_ = this->demand < o->demand;
  }
  else {
    this_local._7_1_ = this->key < o->key;
  }
  return this_local._7_1_;
}

Assistant:

bool Item::operator<(const Item &o) const {
	throw_assert(ndims == o.ndims);
	if (abs(key - o.key) >= 1e-5) {
		return key < o.key;
	}
	for (int i = 0; i < ndims; i++) {
		if (w[i] != o.w[i]) {
			return w[i] < o.w[i];
		}
	}
	return demand < o.demand;
}